

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_2,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,2>
          (Matrix<float,_2,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_2> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Matrix<float,_2,_3> *res;
  int row;
  long lVar5;
  bool bVar6;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  float fVar11;
  Matrix<float,_3,_2> retVal;
  long lVar9;
  
  res = __return_storage_ptr__;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  lVar5 = 0;
  do {
    fVar11 = 1.0;
    if (lVar5 != 0) {
      fVar11 = 0.0;
    }
    retVal.m_data.m_data[0].m_data[lVar5] = fVar11;
    fVar11 = 1.0;
    if (lVar5 != 1) {
      fVar11 = 0.0;
    }
    retVal.m_data.m_data[1].m_data[lVar5] = fVar11;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  fVar11 = *(float *)this;
  fVar1 = *(float *)(this + 4);
  lVar5 = 0;
  do {
    fVar2 = a->m_data[lVar5];
    retVal.m_data.m_data[0].m_data[lVar5] = fVar11 * fVar2;
    retVal.m_data.m_data[1].m_data[lVar5] = fVar2 * fVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data).m_data = ZEXT416(0);
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  auVar4 = _DAT_00ada920;
  auVar3 = _DAT_00ad8f80;
  lVar5 = 0;
  bVar10 = true;
  do {
    bVar6 = bVar10;
    lVar7 = 0;
    auVar8 = auVar4;
    do {
      bVar10 = SUB164(auVar8 ^ auVar3,4) == -0x80000000 && SUB164(auVar8 ^ auVar3,0) < -0x7ffffffd;
      if (bVar10) {
        fVar11 = 1.0;
        if (lVar5 != lVar7) {
          fVar11 = 0.0;
        }
        (__return_storage_ptr__->m_data).m_data[lVar7].m_data[lVar5] = fVar11;
      }
      if (bVar10) {
        fVar11 = 1.0;
        if (lVar5 + -1 != lVar7) {
          fVar11 = 0.0;
        }
        (__return_storage_ptr__->m_data).m_data[lVar7 + 1].m_data[lVar5] = fVar11;
      }
      lVar7 = lVar7 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
    } while (lVar7 != 4);
    lVar5 = 1;
    bVar10 = false;
  } while (bVar6);
  lVar5 = 0;
  do {
    (__return_storage_ptr__->m_data).m_data[lVar5].m_data[0] = retVal.m_data.m_data[0].m_data[lVar5]
    ;
    (__return_storage_ptr__->m_data).m_data[lVar5].m_data[1] = retVal.m_data.m_data[1].m_data[lVar5]
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return res;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}